

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O3

void pbrt::detail::
     stringPrintfRecursive<std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>const&,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>const&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&>
               (string *s,char *fmt,
               vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *v,
               vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *args,
               vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *args_1,
               vector<int,_std::allocator<int>_> *args_2,vector<int,_std::allocator<int>_> *args_3,
               vector<int,_std::allocator<int>_> *args_4)

{
  string *s_00;
  _Alloc_hider __format;
  long *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char *s_01;
  pointer v_00;
  ulong uVar7;
  string nextFmt;
  stringstream ss;
  char *local_240;
  undefined8 local_238;
  char local_230;
  undefined7 uStack_22f;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *local_220;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *local_218;
  vector<int,_std::allocator<int>_> *local_210;
  string *local_208;
  string local_200;
  char *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  char *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_220 = args;
  local_218 = args_1;
  local_210 = args_2;
  local_208 = s;
  local_1e0 = fmt;
  copyToFormatString(&local_200,&local_1e0,s);
  lVar3 = std::__cxx11::string::find('\0',0x2a);
  lVar4 = std::__cxx11::string::find('\0',0x73);
  lVar5 = std::__cxx11::string::find('\0',100);
  if (lVar3 == -1) {
    if (lVar5 == -1) {
      if (lVar4 != -1) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ ",2);
        v_00 = (v->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
        if ((v->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish != v_00) {
          uVar7 = 0;
          do {
            pbrt::operator<<(local_1a8,v_00);
            uVar6 = ((long)(v->
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(v->
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            if (uVar7 < uVar6 - 1) {
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
              uVar6 = ((long)(v->
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(v->
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            }
            uVar7 = uVar7 + 1;
            v_00 = v_00 + 1;
          } while (uVar7 < uVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ]",2);
        __format._M_p = local_200._M_dataplus._M_p;
        std::__cxx11::stringbuf::str();
        plVar1 = local_1d8;
        iVar2 = snprintf((char *)0x0,0,__format._M_p,local_1d8);
        local_238 = 0;
        local_230 = '\0';
        local_240 = &local_230;
        std::__cxx11::string::resize((ulong)&local_240,(char)(iVar2 + 1));
        snprintf(local_240,(long)(iVar2 + 1),__format._M_p,plVar1);
        std::__cxx11::string::pop_back();
        s_00 = local_208;
        std::__cxx11::string::_M_append((char *)local_208,(ulong)local_240);
        if (local_240 != &local_230) {
          operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        stringPrintfRecursive<std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>const&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&>
                  (s_00,local_1e0,local_220,local_218,local_210,args_3,args_4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      if (local_200._M_string_length != 0) {
        local_240 = "St6vectorIN4pbrt6Point3IfEESaIS2_EE";
        local_1b8[0] = local_200._M_dataplus._M_p;
        LogFatal<char_const*,char_const*&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print.h"
                   ,0xb2,"Printf: Non-basic type %s passed for format string %s",&local_240,
                   local_1b8);
      }
      s_01 = "Excess values passed to Printf.";
      iVar2 = 0x10d;
    }
    else {
      s_01 = "Non-integral type passed to %d format.";
      iVar2 = 0x104;
    }
  }
  else {
    s_01 = "Non-integral type provided for %* format.";
    iVar2 = 0xe8;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print.h"
           ,iVar2,s_01);
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}